

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service)

{
  ServiceDescriptor *this;
  string *input;
  string local_38;
  ServiceDescriptor *local_18;
  ServiceDescriptor *service_local;
  Printer *printer_local;
  
  local_18 = service;
  service_local = (ServiceDescriptor *)printer;
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::ServiceDescriptor>((Printer *)service_local,local_18);
  this = service_local;
  input = ServiceDescriptor::full_name_abi_cxx11_(local_18);
  EscapeJavadoc(&local_38,input);
  io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)this," * Protobuf service {@code $fullname$}\n */\n",
             (char (*) [9])"fullname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}